

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool google::protobuf::compiler::ContainsParentReference(string *path)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long *local_58;
  string *local_50;
  long local_48 [2];
  long *local_38;
  string *local_30;
  long local_28 [2];
  
  iVar1 = std::__cxx11::string::compare((char *)path);
  if (iVar1 != 0) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"../","");
    if (((string *)path->_M_string_length < local_30) ||
       (iVar1 = std::__cxx11::string::compare((ulong)path,0,local_30), iVar1 != 0)) {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/..","");
      if (((string *)path->_M_string_length < local_50) ||
         (iVar1 = std::__cxx11::string::compare
                            ((ulong)path,(long)path->_M_string_length - (long)local_50,local_50),
         iVar1 != 0)) {
        lVar2 = std::__cxx11::string::find((char *)path,0x3a4d64,0);
        bVar3 = lVar2 != -1;
      }
      else {
        bVar3 = true;
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
    }
    else {
      bVar3 = true;
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    return bVar3;
  }
  return true;
}

Assistant:

static inline bool ContainsParentReference(const string& path) {
  return path == ".." ||
         HasPrefixString(path, "../") ||
         HasSuffixString(path, "/..") ||
         path.find("/../") != string::npos;
}